

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine.cpp
# Opt level: O1

int __thiscall QFSFileEngine::open(QFSFileEngine *this,char *__file,int __oflag,...)

{
  QFSFileEnginePrivate *this_00;
  bool bVar1;
  undefined7 extraout_var;
  byte in_CL;
  int iVar2;
  long in_FS_OFFSET;
  undefined8 local_58;
  QString QStack_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QFSFileEnginePrivate *)(this->super_QAbstractFileEngine).d_ptr.d;
  QStack_50.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QStack_50.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  QStack_50.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  processOpenModeFlags
            ((ProcessOpenModeResult *)&local_58,
             (QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>)SUB84(__file,0));
  if (local_58._0_1_ == false) {
    QAbstractFileEngine::setError(&this->super_QAbstractFileEngine,OpenError,&QStack_50);
    iVar2 = 0;
  }
  else {
    (this_00->openMode).super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
    super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i = (Int)local_58._4_4_;
    this_00->lastFlushFailed = false;
    this_00->closeFileHandle = (bool)(in_CL & 1);
    QFileSystemEntry::clear(&this_00->fileEntry);
    this_00->field_0xc2 = this_00->field_0xc2 & 0xfb;
    this_00->fd = -1;
    bVar1 = QFSFileEnginePrivate::openFh
                      (this_00,(OpenMode)
                               (this_00->openMode).
                               super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
                               super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i,___oflag);
    iVar2 = (int)CONCAT71(extraout_var,bVar1);
  }
  if (&(QStack_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((QStack_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((QStack_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((QStack_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(QStack_50.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QFSFileEngine::open(QIODevice::OpenMode openMode, FILE *fh, QFile::FileHandleFlags handleFlags)
{
    Q_ASSERT_X(openMode & QIODevice::Unbuffered, "QFSFileEngine::open",
               "QFSFileEngine no longer supports buffered mode; upper layer must buffer");

    Q_D(QFSFileEngine);

    const ProcessOpenModeResult res = processOpenModeFlags(openMode);
    if (!res.ok) {
        setError(QFileDevice::OpenError, res.error);
        return false;
    }

    d->openMode = res.openMode;
    d->lastFlushFailed = false;
    d->closeFileHandle = handleFlags.testAnyFlag(QFile::AutoCloseHandle);
    d->fileEntry.clear();
    d->tried_stat = 0;
    d->fd = -1;

    return d->openFh(d->openMode, fh);
}